

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

bool __thiscall QCalendarWidget::eventFilter(QCalendarWidget *this,QObject *watched,QEvent *event)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  QCalendarWidgetPrivate *this_00;
  QWidget *parent;
  QWidget *this_01;
  QWidget *pQVar4;
  socklen_t *in_RCX;
  QEvent *in_RDX;
  int __fd;
  QEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  QWidget *widget;
  QWidget *tlw;
  QCalendarWidgetPrivate *d;
  QRect geom;
  QPoint mousePos;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QWidget *in_stack_ffffffffffffff60;
  QSize *asize;
  QWidget *in_stack_ffffffffffffff68;
  bool local_51;
  undefined1 *local_38;
  undefined1 *local_30;
  QPointF local_28;
  QPoint local_18;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QCalendarWidget *)0x52113a);
  TVar3 = QEvent::type(in_RDX);
  if ((TVar3 == MouseButtonPress) && (bVar1 = QWidget::hasFocus(in_stack_ffffffffffffff68), bVar1))
  {
    parent = QWidget::window(in_stack_ffffffffffffff60);
    this_01 = qobject_cast<QWidget*>
                        ((QObject *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if ((this_01 == (QWidget *)0x0) ||
       (pQVar4 = QWidget::window(in_stack_ffffffffffffff60), pQVar4 != parent)) {
      bVar2 = QObject::eventFilter(&in_RDI->super_QObject,in_RSI);
      local_51 = (bool)(bVar2 & 1);
      goto LAB_0052131e;
    }
    local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)0x5211ef);
    local_18 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff60);
    local_10 = QWidget::mapTo(in_RDI,in_stack_ffffffffffffff68,(QPoint *)in_stack_ffffffffffffff60);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    asize = (QSize *)this_00->yearEdit;
    QPoint::QPoint((QPoint *)this_01,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    QWidget::mapTo(in_RDI,parent,(QPoint *)asize);
    QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QRect::QRect((QRect *)in_RDI,(QPoint *)parent,asize);
    __fd = (int)&local_10;
    auVar5 = QRect::contains((QPoint *)&local_38,SUB81(&local_10,0));
    if ((auVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      QEvent::accept(in_RDX,__fd,auVar5._8_8_,in_RCX);
      QCalendarWidgetPrivate::_q_yearEditingFinished(this_00);
      QWidget::setFocus((QWidget *)0x5212fb);
      local_51 = true;
      goto LAB_0052131e;
    }
  }
  bVar2 = QObject::eventFilter(&in_RDI->super_QObject,in_RSI);
  local_51 = (bool)(bVar2 & 1);
LAB_0052131e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QCalendarWidget::eventFilter(QObject *watched, QEvent *event)
{
    Q_D(QCalendarWidget);
    if (event->type() == QEvent::MouseButtonPress && d->yearEdit->hasFocus()) {
        // We can get filtered press events that were intended for Qt Virtual Keyboard's
        // input panel (QQuickView), so we have to make sure that the window is indeed a QWidget - no static_cast.
        // In addition, as we have a event filter on the whole application we first make sure that the top level widget
        // of both this and the watched widget are the same to decide if we should finish the year edition.
        QWidget *tlw = window();
        QWidget *widget = qobject_cast<QWidget *>(watched);
        if (!widget || widget->window() != tlw)
            return QWidget::eventFilter(watched, event);

        QPoint mousePos = widget->mapTo(tlw, static_cast<QMouseEvent *>(event)->position().toPoint());
        QRect geom = QRect(d->yearEdit->mapTo(tlw, QPoint(0, 0)), d->yearEdit->size());
        if (!geom.contains(mousePos)) {
            event->accept();
            d->_q_yearEditingFinished();
            setFocus();
            return true;
        }
    }
    return QWidget::eventFilter(watched, event);
}